

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O1

void __thiscall
tchecker::zg::path::concrete::node_t::node_t
          (node_t *this,const_state_sptr_t *s,const_clockval_sptr_t *clockval,bool initial,
          bool final)

{
  clockval_t *clockval_00;
  zone_t *this_00;
  bool bVar1;
  invalid_argument *this_01;
  char *__function;
  
  graph::node_flags_t::node_flags_t((node_flags_t *)this,initial,final);
  graph::node_zg_state_t::node_zg_state_t(&(this->super_node_t).super_node_zg_state_t,s);
  (this->_clockval)._t = (make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)0x0;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
  reset(&this->_clockval,clockval->_t);
  clockval_00 = &((this->_clockval)._t)->super_clockval_t;
  if (clockval_00 == (clockval_t *)0x0) {
    __function = 
    "T *tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::clockval_t>>::operator->() const [T = const tchecker::make_shared_t<tchecker::clockval_t>]"
    ;
  }
  else {
    if (s->_t != (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) {
      this_00 = &((s->_t->super_state_t)._zone._t)->super_zone_t;
      if (this_00 == (zone_t *)0x0) {
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
                     );
      }
      if (this_00->_dim ==
          (uint)(clockval_00->super_clock_value_array_t).super_clockval_base_t.
                super_array_capacity_t<unsigned_short>._capacity) {
        bVar1 = zone_t::belongs(this_00,clockval_00);
        if (bVar1) {
          return;
        }
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_01,"clock valuation does not belong to the zone");
      }
      else {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_01,"clock values and zone do not have the same size");
      }
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    __function = 
    "T *tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::zg::state_t>>::operator->() const [T = const tchecker::make_shared_t<tchecker::zg::state_t>]"
    ;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,__function);
}

Assistant:

node_t::node_t(tchecker::zg::const_state_sptr_t const & s, tchecker::const_clockval_sptr_t const & clockval, bool initial,
               bool final)
    : tchecker::zg::path::symbolic::node_t(s, initial, final), _clockval(clockval)
{
  if (_clockval->size() != s->zone().dim())
    throw std::invalid_argument("clock values and zone do not have the same size");

  if (!s->zone().belongs(*_clockval))
    throw std::invalid_argument("clock valuation does not belong to the zone");
}